

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  ushort uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  ushort *puVar5;
  ulong uVar6;
  void *__src;
  char *__dest;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort *local_58;
  char *local_50;
  char *local_48;
  long local_40;
  size_t local_38;
  
  pcVar4 = dest + originalSize;
  local_40 = (long)dictStart + dictSize;
  local_58 = (ushort *)source;
  local_50 = dest;
  local_48 = source;
  local_38 = dictSize;
  while( true ) {
    puVar5 = (ushort *)((long)local_58 + 1);
    uVar1 = *local_58;
    uVar7 = (uint)(byte)((byte)uVar1 >> 4);
    uVar8 = (ulong)uVar7;
    local_58 = puVar5;
    if (uVar7 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_58);
      uVar8 = sVar2 + 0xf;
    }
    puVar5 = local_58;
    if ((ulong)((long)pcVar4 - (long)dest) < uVar8) {
      return -1;
    }
    memmove(dest,local_58,uVar8);
    __dest = dest + uVar8;
    puVar5 = (ushort *)((long)puVar5 + uVar8);
    if ((ulong)((long)pcVar4 - (long)__dest) < 0xc) {
      if (__dest == pcVar4) {
        return (int)puVar5 - (int)local_48;
      }
      return -1;
    }
    uVar8 = (ulong)((byte)uVar1 & 0xf);
    uVar9 = (ulong)*puVar5;
    local_58 = puVar5 + 1;
    if (uVar8 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_58);
      uVar8 = sVar2 + 0xf;
    }
    uVar8 = uVar8 + 4;
    if ((ulong)((long)pcVar4 - (long)__dest) < uVar8) break;
    uVar6 = (long)__dest - (long)local_50;
    if (local_38 + uVar6 < uVar9) {
      return -1;
    }
    if (uVar6 < uVar9) {
      __src = (void *)((uVar6 - uVar9) + local_40);
      uVar9 = local_40 - (long)__src;
      uVar6 = uVar8 - uVar9;
      if (uVar8 < uVar9) {
        memmove(__dest,__src,uVar8);
        uVar6 = 0;
        uVar9 = uVar8;
      }
      else {
        memmove(__dest,__src,uVar9);
      }
      __dest = __dest + uVar9;
      pcVar3 = local_50;
      uVar8 = uVar6;
    }
    else {
      pcVar3 = __dest + -uVar9;
    }
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      __dest[uVar9] = pcVar3[uVar9];
    }
    dest = __dest + uVar8;
    if ((ulong)((long)pcVar4 - (long)dest) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, (const BYTE*)dictStart, dictSize);
}